

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadCommandBufferCase::iterate(BadCommandBufferCase *this)

{
  pointer pcVar1;
  uint uVar2;
  RenderContext *renderCtx;
  deUint32 dVar3;
  deUint32 err;
  ProgramSources *pPVar4;
  char *description;
  bool bVar5;
  deUint32 drawIndirectBuf;
  deUint32 indexBuf;
  deUint32 positionBuf;
  deUint32 vaoID;
  allocator<char> local_4b2;
  allocator<char> local_4b1;
  deUint16 indices [3];
  vector<signed_char,_std::allocator<signed_char>_> drawCommandBuffer;
  string local_480;
  string local_460;
  undefined1 local_440 [8];
  deUint32 local_438;
  GLContext gl;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [8];
  pointer pbStack_270;
  pointer local_1c8;
  undefined1 uStack_1c0;
  undefined7 uStack_1bf;
  undefined1 uStack_1b8;
  undefined8 uStack_1b7;
  ShaderProgram program;
  
  local_2a8 = 0;
  uStack_2a0 = 0x3f80000000000000;
  local_298 = 0x3f800000;
  uStack_290 = 0x3f80000000000000;
  local_288 = 0x3f80000000000000;
  uStack_280 = 0x3f80000000000000;
  indices[2] = 1;
  indices[0] = 0;
  indices[1] = 2;
  local_278 = (undefined1  [8])0x0;
  pbStack_270 = (pointer)&DAT_100000001;
  sglr::GLContext::GLContext
            (&gl,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,1,
             (IVec4 *)local_278);
  vaoID = 0;
  positionBuf = 0;
  indexBuf = 0;
  drawIndirectBuf = 0;
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_278,0,0xac);
  local_1c8 = (pointer)0x0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  uStack_1b8 = 0;
  uStack_1b7 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,
             "#version 310 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_4b1);
  glu::VertexSource::VertexSource((VertexSource *)&drawCommandBuffer,&local_480);
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)local_278,(ShaderSource *)&drawCommandBuffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,
             "#version 310 es\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_4b2);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_440,&local_460);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_440);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar4);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string
            ((string *)
             &drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_480);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_278);
  dVar3 = sglr::GLContext::getAttribLocation(&gl,program.m_program.m_program,"a_position");
  drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&drawCommandBuffer,(ulong)this->m_bufferSize);
  memset(drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
         super__Vector_impl_data._M_start,0,
         (long)((int)drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (int)drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start));
  if (this->m_writeCommandToBuffer == true) {
    uVar2 = this->m_alignment;
    pcVar1 = drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
             .super__Vector_impl_data._M_start + uVar2;
    pcVar1[0] = '\x03';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\x01';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    pcVar1 = drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
             .super__Vector_impl_data._M_start + (ulong)uVar2 + 0x10;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
  }
  err = sglr::GLContext::getError(&gl);
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x91d);
  sglr::GLContext::genVertexArrays(&gl,1,&vaoID);
  sglr::GLContext::bindVertexArray(&gl,vaoID);
  sglr::GLContext::genBuffers(&gl,1,&positionBuf);
  sglr::GLContext::bindBuffer(&gl,0x8892,positionBuf);
  sglr::GLContext::bufferData(&gl,0x8892,0x30,&local_2a8,0x88e4);
  sglr::GLContext::vertexAttribPointer(&gl,dVar3,4,0x1406,0,0,(void *)0x0);
  sglr::GLContext::vertexAttribDivisor(&gl,dVar3,0);
  sglr::GLContext::enableVertexAttribArray(&gl,dVar3);
  dVar3 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x927);
  sglr::GLContext::genBuffers(&gl,1,&indexBuf);
  sglr::GLContext::bindBuffer(&gl,0x8893,indexBuf);
  sglr::GLContext::bufferData(&gl,0x8893,6,indices,0x88e4);
  dVar3 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x92c);
  sglr::GLContext::genBuffers(&gl,1,&drawIndirectBuf);
  sglr::GLContext::bindBuffer(&gl,0x8f3f,drawIndirectBuf);
  sglr::GLContext::bufferData
            (&gl,0x8f3f,
             (long)drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
             .super__Vector_impl_data._M_start,0x88e4);
  dVar3 = sglr::GLContext::getError(&gl);
  glu::checkError(dVar3,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x931);
  sglr::GLContext::viewport(&gl,0,0,1,1);
  sglr::GLContext::useProgram(&gl,program.m_program.m_program);
  sglr::GLContext::drawElementsIndirect(&gl,4,0x1403,(void *)(ulong)this->m_alignment);
  dVar3 = sglr::GLContext::getError(&gl);
  sglr::GLContext::useProgram(&gl,0);
  sglr::GLContext::deleteBuffers(&gl,1,&drawIndirectBuf);
  sglr::GLContext::deleteBuffers(&gl,1,&indexBuf);
  sglr::GLContext::deleteBuffers(&gl,1,&positionBuf);
  sglr::GLContext::deleteVertexArrays(&gl,1,&vaoID);
  local_278 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_270);
  std::operator<<((ostream *)&pbStack_270,"drawElementsIndirect generated ");
  local_440 = (undefined1  [8])glu::getErrorName;
  local_438 = dVar3;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_440,(ostream *)&pbStack_270);
  std::operator<<((ostream *)&pbStack_270,", expecting ");
  local_480._M_string_length._0_4_ = this->m_expectedError;
  local_480._M_dataplus._M_p = (pointer)glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_480,(ostream *)&pbStack_270);
  std::operator<<((ostream *)&pbStack_270,".");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_270);
  bVar5 = dVar3 != this->m_expectedError;
  if (bVar5) {
    local_278 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pbStack_270);
    std::operator<<((ostream *)&pbStack_270,"\tUnexpected error.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_278,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pbStack_270);
    description = "Got unexpected error.";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar5,description)
  ;
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  glu::ShaderProgram::~ShaderProgram(&program);
  sglr::GLContext::~GLContext(&gl);
  return STOP;
}

Assistant:

BadCommandBufferCase::IterateResult	BadCommandBufferCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0,	0,		0, 1),
		tcu::Vec4(1,	0,		0, 1),
		tcu::Vec4(0,	1,		0, 1),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	DE_STATIC_ASSERT(CommandSize == sizeof(DrawElementsCommand));

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32 vaoID			= 0;
	deUint32 positionBuf	= 0;
	deUint32 indexBuf		= 0;
	deUint32 drawIndirectBuf= 0;
	deUint32 error;

	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			programID		= program.getProgram();
	deInt32				posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	std::vector<deInt8> drawCommandBuffer;
	drawCommandBuffer.resize(m_bufferSize);

	deMemset(&drawCommandBuffer[0], 0, (int)drawCommandBuffer.size());

	if (m_writeCommandToBuffer)
	{
		DE_ASSERT(drawCommandBuffer.size() >= sizeof(drawCommand) + m_alignment);
		deMemcpy(&drawCommandBuffer[m_alignment], &drawCommand, sizeof(drawCommand));
	}

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	gl.genVertexArrays(1, &vaoID);
	gl.bindVertexArray(vaoID);

	gl.genBuffers(1, &positionBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, positionBuf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.vertexAttribDivisor(posLocation, 0);
	gl.enableVertexAttribArray(posLocation);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &indexBuf);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &drawIndirectBuf);
	gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, drawIndirectBuf);
	gl.bufferData(GL_DRAW_INDIRECT_BUFFER, drawCommandBuffer.size(), &drawCommandBuffer[0], GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (const void*)(deUintptr)m_alignment);

	error = gl.getError();

	gl.useProgram(0);

	gl.deleteBuffers(1, &drawIndirectBuf);
	gl.deleteBuffers(1, &indexBuf);
	gl.deleteBuffers(1, &positionBuf);
	gl.deleteVertexArrays(1, &vaoID);

	m_testCtx.getLog() << tcu::TestLog::Message << "drawElementsIndirect generated " << glu::getErrorStr(error) << ", expecting " << glu::getErrorStr(m_expectedError) << "." << tcu::TestLog::EndMessage;

	if (error == m_expectedError)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tUnexpected error." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}